

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O0

size_t prediction_and_quantization_3d<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int size_x_00;
  int size_y_00;
  int size_z_00;
  int iVar4;
  void *__s;
  int **type_pos_00;
  meanInfo<float> *mean_info_00;
  size_t dim0_offset;
  int **type_pos_01;
  int in_ECX;
  byte *in_RDX;
  ulong *in_RSI;
  int **in_RDI;
  char *in_R9;
  float fVar5;
  double in_XMM0_Qa;
  long in_stack_00000010;
  float *in_stack_00000020;
  int min_size;
  int size_z;
  int size_y;
  int size_x;
  size_t k;
  float *z_data_pos;
  size_t j;
  float *y_data_pos;
  size_t i_2;
  float *x_data_pos;
  int capacity_lorenzo;
  size_t reg_count;
  float *pred_buffer;
  size_t buffer_dim1_offset;
  size_t buffer_dim0_offset;
  int i_1;
  float rel_param_err;
  double reg_precisions [4];
  int *reg_params_type_pos;
  float *reg_params_pos;
  int i;
  float *reg_params;
  uchar *indicator_pos;
  int *type_pos;
  float noise;
  float **in_stack_fffffffffffffe78;
  float *in_stack_fffffffffffffe80;
  float *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  float *in_stack_fffffffffffffe98;
  float *in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int size_z_01;
  int iVar6;
  undefined4 in_stack_fffffffffffffed0;
  int iVar7;
  int iVar8;
  ulong dim1_offset;
  float **unpredictable_data_pos_00;
  int **local_100;
  ulong local_f8;
  int **local_f0;
  size_t local_e0;
  int local_c0;
  double local_b8 [5];
  long local_90;
  float *local_88;
  int local_7c;
  void *local_78;
  char *local_70;
  float local_68 [3];
  float local_5c;
  int local_4c;
  double local_48;
  byte *local_40;
  ulong *local_38;
  int **local_30;
  
  local_5c = (float)(in_XMM0_Qa * 1.22);
  local_70 = in_R9;
  local_4c = in_ECX;
  local_48 = in_XMM0_Qa;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  local_78 = malloc((in_RSI[8] + 1) * 0x10);
  for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
    *(undefined4 *)((long)local_78 + (long)local_7c * 4) = 0;
  }
  local_88 = (float *)((long)local_78 + 0x10);
  local_90 = in_stack_00000010;
  fVar5 = (float)((local_48 * 0.1) / 4.0);
  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
    local_b8[local_c0] = (double)(fVar5 / (float)(int)local_38[4]);
  }
  local_b8[3] = (double)fVar5;
  uVar1 = local_38[4];
  uVar2 = local_38[4];
  uVar3 = local_38[4];
  __s = malloc((long)(((int)local_38[4] + 1) * ((int)local_38[4] + 1) * ((int)local_38[4] + 1)) << 2
              );
  memset(__s,0,(long)(((int)local_38[4] + 1) * ((int)local_38[4] + 1) * ((int)local_38[4] + 1)) << 2
        );
  local_e0 = 0;
  iVar7 = local_4c;
  if ((*local_40 & 1) != 0) {
    iVar7 = local_4c + -2;
  }
  local_f0 = local_30;
  for (local_f8 = 0; local_f8 < local_38[5]; local_f8 = local_f8 + 1) {
    local_100 = local_f0;
    for (unpredictable_data_pos_00 = (float **)0x0;
        unpredictable_data_pos_00 < (float **)local_38[6];
        unpredictable_data_pos_00 = (float **)((long)unpredictable_data_pos_00 + 1)) {
      type_pos_01 = local_100;
      for (dim1_offset = 0; dim1_offset < local_38[7]; dim1_offset = dim1_offset + 1) {
        if ((local_f8 + 1) * (long)(int)local_38[4] < *local_38) {
          type_pos_00 = (int **)(long)(int)local_38[4];
        }
        else {
          type_pos_00 = (int **)(*local_38 - local_f8 * (long)(int)local_38[4]);
        }
        size_x_00 = (int)type_pos_00;
        if (((long)unpredictable_data_pos_00 + 1U) * (long)(int)local_38[4] < local_38[1]) {
          mean_info_00 = (meanInfo<float> *)(long)(int)local_38[4];
        }
        else {
          mean_info_00 = (meanInfo<float> *)
                         (local_38[1] - (long)unpredictable_data_pos_00 * (long)(int)local_38[4]);
        }
        size_y_00 = (int)mean_info_00;
        if ((dim1_offset + 1) * (long)(int)local_38[4] < local_38[2]) {
          dim0_offset = (size_t)(int)local_38[4];
        }
        else {
          dim0_offset = local_38[2] - dim1_offset * (long)(int)local_38[4];
        }
        size_z_00 = (int)dim0_offset;
        iVar6 = size_y_00;
        if (size_x_00 < size_y_00) {
          iVar6 = size_x_00;
        }
        size_z_01 = size_z_00;
        if (iVar6 < size_z_00) {
          size_z_01 = iVar6;
        }
        iVar8 = size_z_01;
        if (size_z_01 < 4) {
          *local_70 = '\0';
        }
        else {
          compute_regression_coeffcients_3d<float>
                    ((float *)type_pos_01,size_x_00,size_y_00,size_z_00,local_38[9],local_38[10],
                     local_88);
          iVar4 = sz_blockwise_selection_3d<float>
                            ((float *)type_pos_00,mean_info_00,dim0_offset,CONCAT44(iVar6,size_z_01)
                             ,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                             in_stack_fffffffffffffea0);
          *local_70 = (char)iVar4;
        }
        if (*local_70 == '\0') {
          in_stack_fffffffffffffe88 = (float *)local_38[9];
          in_stack_fffffffffffffe90 = (double *)local_38[10];
          in_stack_fffffffffffffe98 = local_68;
          in_stack_fffffffffffffe78 = (float **)(long)(((int)uVar1 + 1) * ((int)uVar2 + 1));
          in_stack_fffffffffffffe80 = (float *)(long)((int)uVar3 + 1);
          in_stack_fffffffffffffea0 = in_stack_00000020;
          block_pred_and_quant_lorenzo_3d<float>
                    ((meanInfo<float> *)CONCAT44(iVar6,size_z_01),
                     (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_00000020,(double)in_stack_fffffffffffffe98,
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)mean_info_00,
                     (int)type_pos_00,CONCAT44(iVar7,in_stack_fffffffffffffed0),
                     CONCAT44(size_z_00,iVar8),CONCAT44(size_x_00,size_y_00),dim1_offset,type_pos_01
                     ,unpredictable_data_pos_00);
        }
        else {
          compress_regression_coefficient_3d
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (int *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          in_stack_fffffffffffffe78 = (float **)local_38[10];
          in_stack_fffffffffffffe80 = local_68;
          in_stack_fffffffffffffe88 = in_stack_00000020;
          block_pred_and_quant_regression_3d<float>
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (double)in_stack_fffffffffffffe90,(int)((ulong)in_stack_00000020 >> 0x20),
                     (int)in_stack_00000020,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                     (int)in_stack_fffffffffffffe80,size_z_01,dim0_offset,(size_t)mean_info_00,
                     type_pos_00,(float **)CONCAT44(iVar7,in_stack_fffffffffffffed0));
          local_e0 = local_e0 + 1;
          local_88 = local_88 + 4;
          local_90 = local_90 + 0x10;
        }
        local_70 = local_70 + 1;
        type_pos_01 = (int **)((long)type_pos_01 + (long)size_z_00 * 4);
      }
      local_100 = (int **)((long)(int)local_38[4] * local_38[10] * 4 + (long)local_100);
    }
    local_f0 = (int **)((long)(int)local_38[4] * local_38[9] * 4 + (long)local_f0);
  }
  free(__s);
  free(local_78);
  return local_e0;
}

Assistant:

size_t
prediction_and_quantization_3d(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	size_t buffer_dim0_offset = (size.block_size + 1) * (size.block_size + 1);
	size_t buffer_dim1_offset = size.block_size + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d(z_data_pos, reg_params_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
		}
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}